

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall
fmt::v11::detail::do_format_base2e<char,unsigned__int128>
          (detail *this,int base_bits,char *out,unsigned___int128 value,int size,bool upper)

{
  ulong uVar1;
  uint uVar2;
  undefined4 in_register_0000000c;
  char *pcVar3;
  undefined4 in_register_00000034;
  char *pcVar4;
  undefined3 in_register_00000081;
  byte in_R9B;
  char local_59;
  char *local_58;
  uint digit;
  char *digits;
  bool upper_local;
  int size_local;
  unsigned___int128 value_local;
  char *out_local;
  int base_bits_local;
  
  value_local._8_8_ = (char *)CONCAT44(in_register_0000000c,size);
  value_local._0_8_ = out;
  out_local = (char *)(CONCAT44(in_register_00000034,base_bits) +
                      (long)CONCAT31(in_register_00000081,upper));
  do {
    if ((in_R9B & 1) == 0) {
      local_58 = "0123456789abcdef";
    }
    else {
      local_58 = "0123456789ABCDEF";
    }
    base_bits_local._0_1_ = (byte)this;
    uVar2 = (uint)value_local & (1 << ((byte)base_bits_local & 0x1f)) - 1U;
    if ((int)this < 4) {
      local_59 = (char)uVar2 + '0';
    }
    else {
      local_59 = local_58[uVar2];
    }
    pcVar3 = out_local + -1;
    out_local[-1] = local_59;
    pcVar4 = (char *)((ulong)value_local._8_8_ >> ((byte)base_bits_local & 0x3f));
    uVar1 = (long)value_local._8_8_ << 0x40 - ((byte)base_bits_local & 0x3f);
    value_local._8_8_ = pcVar4;
    value_local._0_8_ =
         (char *)((ulong)(char *)value_local >> ((byte)base_bits_local & 0x3f) | uVar1);
    if (((ulong)this & 0x40) != 0) {
      value_local._8_8_ = (char *)0x0;
      value_local._0_8_ = pcVar4;
    }
    out_local = pcVar3;
  } while ((char *)value_local != (char *)0x0 || value_local._8_8_ != (char *)0x0);
  return pcVar3;
}

Assistant:

FMT_CONSTEXPR auto do_format_base2e(int base_bits, Char* out, UInt value,
                                    int size, bool upper = false) -> Char* {
  out += size;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = static_cast<unsigned>(value & ((1 << base_bits) - 1));
    *--out = static_cast<Char>(base_bits < 4 ? static_cast<char>('0' + digit)
                                             : digits[digit]);
  } while ((value >>= base_bits) != 0);
  return out;
}